

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.hpp
# Opt level: O0

void __thiscall
backend::codegen::FunctionNotFoundError::FunctionNotFoundError
          (FunctionNotFoundError *this,string *fn_id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  exception *in_RDI;
  string local_30 [32];
  exception *__lhs;
  
  __lhs = in_RDI;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__FunctionNotFoundError_0036f220;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::operator+((char *)__lhs,in_RSI);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

FunctionNotFoundError(std::string fn_id) : std::exception() {
    what_ = "Function not found: " + fn_id;
  }